

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.h
# Opt level: O1

FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_spvtools::opt::(anonymous_namespace)::ExcludePhiDefinedInBlock>
* __thiscall
spvtools::opt::
MakeFilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction*,true,false>,spvtools::opt::(anonymous_namespace)::ExcludePhiDefinedInBlock>
          (FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_spvtools::opt::(anonymous_namespace)::ExcludePhiDefinedInBlock>
           *__return_storage_ptr__,opt *this,
          _Node_iterator<spvtools::opt::Instruction_*,_true,_false> *begin,
          _Node_iterator<spvtools::opt::Instruction_*,_true,_false> *end,
          ExcludePhiDefinedInBlock predicate)

{
  __node_type *p_Var1;
  bool bVar2;
  __node_type *p_Var3;
  
  p_Var3 = *(__node_type **)this;
  p_Var1 = (begin->super__Node_iterator_base<spvtools::opt::Instruction_*,_false>)._M_cur;
  (__return_storage_ptr__->cur_).super__Node_iterator_base<spvtools::opt::Instruction_*,_false>.
  _M_cur = p_Var3;
  (__return_storage_ptr__->end_).super__Node_iterator_base<spvtools::opt::Instruction_*,_false>.
  _M_cur = p_Var1;
  (__return_storage_ptr__->predicate_).context_ = (IRContext *)end;
  (__return_storage_ptr__->predicate_).bb_ = (BasicBlock *)predicate.context_;
  bVar2 = FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_spvtools::opt::(anonymous_namespace)::ExcludePhiDefinedInBlock>
          ::IsPredicateSatisfied(__return_storage_ptr__);
  if (p_Var3 != p_Var1 && !bVar2) {
    do {
      p_Var3 = (__node_type *)(p_Var3->super__Hash_node_base)._M_nxt;
      (__return_storage_ptr__->cur_).super__Node_iterator_base<spvtools::opt::Instruction_*,_false>.
      _M_cur = p_Var3;
      bVar2 = FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_spvtools::opt::(anonymous_namespace)::ExcludePhiDefinedInBlock>
              ::IsPredicateSatisfied(__return_storage_ptr__);
    } while (!bVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

FilterIterator<SubIterator, Predicate> MakeFilterIterator(
    const SubIterator& begin, const SubIterator& end, Predicate predicate) {
  return MakeFilterIterator(make_range(begin, end), predicate);
}